

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<long_double>::make_l1_norm
          (default_cost_type<long_double> *this,int n)

{
  longdouble *plVar1;
  ulong uVar2;
  long lVar3;
  longdouble lVar4;
  ulong local_18;
  ushort uStack_10;
  
  if (n != 0) {
    lVar3 = 0;
    lVar4 = (longdouble)0;
    do {
      plVar1 = (longdouble *)
               ((long)(this->linear_elements)._M_t.
                      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                      super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar3);
      lVar3 = lVar3 + 0x10;
      lVar4 = ABS(*plVar1) + lVar4;
    } while ((ulong)(uint)n << 4 != lVar3);
    local_18 = SUB108(lVar4,0);
    uStack_10 = (ushort)((unkuint10)lVar4 >> 0x40);
    uVar2 = (ulong)uStack_10 & 0x7fff;
    if ((((~((byte)((unkuint10)lVar4 >> 0x38) >> 7 ^ ((unkuint10)lVar4 & 0x7fff) == 0) & 1) == 0 &&
         (SBORROW8(0x7fff,uVar2) != SBORROW8(0x7fff - uVar2,(ulong)(0x8000000000000000 < local_18)))
         == (long)((0x7fff - uVar2) - (ulong)(0x8000000000000000 < local_18)) < 0) &&
        ((ulong)(local_18 - 1 < 0x7fffffffffffffff) <= (uVar2 - 1) + (ulong)(local_18 != 0) &&
        ((local_18 != 0x8000000000000000 || uVar2 != 0x7fff) &&
        (local_18 != 0 || (ulong)uStack_10 != 0)))) && n != 0) {
      plVar1 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
               super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
      lVar3 = 0;
      do {
        *(longdouble *)((long)plVar1 + lVar3) = *(longdouble *)((long)plVar1 + lVar3) / lVar4;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)n << 4 != lVar3);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }